

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndtri.c
# Opt level: O2

double hcephes_ndtri(double y0)

{
  double *coef;
  double *coef_00;
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  double local_28;
  
  if (y0 <= 0.0) {
    hcephes_mtherr("ndtri",1);
    dVar6 = -INFINITY;
  }
  else if (1.0 <= y0) {
    hcephes_mtherr("ndtri",1);
    dVar6 = INFINITY;
  }
  else {
    uVar1 = -(ulong)(0.8646647167633873 < y0);
    dVar6 = (double)(~uVar1 & (ulong)y0 | (ulong)(1.0 - y0) & uVar1);
    if (dVar6 <= 0.1353352832366127) {
      dVar6 = log(dVar6);
      dVar6 = dVar6 * -2.0;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      auVar5._0_8_ = log(dVar6);
      coef_00 = P2;
      if (dVar6 < 8.0) {
        coef_00 = P1;
      }
      coef = Q2;
      if (dVar6 < 8.0) {
        coef = Q1;
      }
      auVar5._8_8_ = 0x3ff0000000000000;
      auVar7._8_8_ = dVar6;
      auVar7._0_8_ = dVar6;
      auVar5 = divpd(auVar5,auVar7);
      dVar4 = auVar5._8_8_;
      dVar2 = hcephes_polevl(dVar4,coef_00,8);
      dVar3 = hcephes_p1evl(dVar4,coef,8);
      local_28 = auVar5._0_8_;
      dVar6 = (dVar6 - local_28) - (dVar2 * dVar4) / dVar3;
      dVar6 = (double)(~uVar1 & (ulong)-dVar6 | uVar1 & (ulong)dVar6);
    }
    else {
      dVar6 = dVar6 + -0.5;
      dVar2 = dVar6 * dVar6;
      dVar3 = hcephes_polevl(dVar2,P0,4);
      dVar4 = hcephes_p1evl(dVar2,Q0,8);
      dVar6 = (((dVar3 * dVar2) / dVar4) * dVar6 + dVar6) * 2.5066282746310007;
    }
  }
  return dVar6;
}

Assistant:

HCEPHES_API double hcephes_ndtri(double y0) {
    double x, y, z, y2, x0, x1;
    int code;

    if (y0 <= 0.0) {
        hcephes_mtherr("ndtri", HCEPHES_DOMAIN);
        return (-HUGE_VAL);
    }
    if (y0 >= 1.0) {
        hcephes_mtherr("ndtri", HCEPHES_DOMAIN);
        return (HUGE_VAL);
    }
    code = 1;
    y = y0;
    if (y > (1.0 - 0.13533528323661269189)) /* 0.135... = exp(-2) */
    {
        y = 1.0 - y;
        code = 0;
    }

    if (y > 0.13533528323661269189) {
        y = y - 0.5;
        y2 = y * y;
        x = y + y * (y2 * hcephes_polevl(y2, P0, 4) / hcephes_p1evl(y2, Q0, 8));
        x = x * s2pi;
        return (x);
    }

    x = sqrt(-2.0 * log(y));
    x0 = x - log(x) / x;

    z = 1.0 / x;
    if (x < 8.0) /* y > exp(-32) = 1.2664165549e-14 */
        x1 = z * hcephes_polevl(z, P1, 8) / hcephes_p1evl(z, Q1, 8);
    else
        x1 = z * hcephes_polevl(z, P2, 8) / hcephes_p1evl(z, Q2, 8);
    x = x0 - x1;
    if (code != 0)
        x = -x;
    return (x);
}